

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O3

optional<slang::TimeScaleValue> slang::parseValue(string_view str,size_t *lengthConsumed)

{
  _Storage<slang::TimeScaleValue,_true> _Var1;
  optional<slang::TimeScaleValue> oVar2;
  optional<int> oVar3;
  byte bVar4;
  bool bVar5;
  undefined8 uVar6;
  slang *this;
  int in_R8D;
  _Storage<int,_true> _Var7;
  string_view str_00;
  string_view timeSuffix;
  size_t unitConsumed;
  long local_38;
  slang *local_30;
  
  str_00._M_len = str._M_str;
  this = (slang *)str._M_len;
  uVar6 = 0;
  str_00._M_str = (char *)&local_30;
  oVar3 = strToInt(this,str_00,(size_t *)0xa,in_R8D);
  _Var1 = oVar3.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _4_2_;
  bVar4 = local_30 < this &
          oVar3.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged;
  if (bVar4 == 1) {
    do {
      if (str_00._M_len[(long)local_30] != ' ') {
        timeSuffix._M_str = (char *)&local_38;
        timeSuffix._M_len = (size_t)(str_00._M_len + (long)local_30);
        _Var1._M_value =
             (TimeScaleValue)
             suffixToTimeUnit(this + -(long)local_30,timeSuffix,
                              (size_t *)CONCAT71((int7)((ulong)uVar6 >> 8),bVar4));
        if (((ushort)_Var1 >> 8 & 1) == 0) break;
        *lengthConsumed = (size_t)(local_30 + local_38);
        _Var7._M_value =
             oVar3.super__Optional_base<int,_true,_true>._M_payload.
             super__Optional_payload_base<int>._M_payload;
        if (_Var7._M_value == 100) {
          _Var1 = (_Storage<slang::TimeScaleValue,_true>)((ushort)_Var1 & 0xff | 0x6400);
        }
        else if (_Var7._M_value == 10) {
          _Var1 = (_Storage<slang::TimeScaleValue,_true>)((ushort)_Var1 & 0xff | 0xa00);
        }
        else {
          if (_Var7._M_value != 1) break;
          _Var1 = (_Storage<slang::TimeScaleValue,_true>)((ushort)_Var1 & 0x1ff);
        }
        bVar5 = true;
        goto LAB_0022dae7;
      }
      local_30 = local_30 + 1;
    } while (this != local_30);
  }
  bVar5 = false;
LAB_0022dae7:
  oVar2.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScaleValue>._M_engaged = bVar5;
  oVar2.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScaleValue>._M_payload = _Var1;
  return (optional<slang::TimeScaleValue>)
         oVar2.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
         super__Optional_payload_base<slang::TimeScaleValue>;
}

Assistant:

static std::optional<TimeScaleValue> parseValue(std::string_view str, size_t& lengthConsumed) {
    size_t idx;
    auto i = strToInt(str, &idx);
    if (!i)
        return {};

    while (idx < str.size() && str[idx] == ' ')
        idx++;

    if (idx >= str.size())
        return {};

    size_t unitConsumed;
    auto unit = suffixToTimeUnit(str.substr(idx), unitConsumed);
    if (!unit)
        return {};

    lengthConsumed = idx + unitConsumed;
    return TimeScaleValue::fromLiteral(double(*i), *unit);
}